

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_regtest.c
# Opt level: O2

int main(int argc,char **argv)

{
  ErrorNumber EVar1;
  char *pcVar2;
  time_t tVar3;
  TA_History local_50;
  
  insufficientClockPrecision = 0;
  timeInProfiledCall = 0.0;
  worstProfiledCall = 0.0;
  nbProfiledCall = 0;
  doExtensiveProfiling = 0;
  putchar(10);
  pcVar2 = TA_GetVersionString();
  printf("ta_regtest V%s - Regression Tests of TA-Lib code\n",pcVar2);
  putchar(10);
  if (argc == 2) {
    pcVar2 = argv[1];
    if (((*pcVar2 != '-') || (pcVar2[1] != 'p')) || (pcVar2[2] != '\0')) {
LAB_001133d0:
      printUsage();
      return 1;
    }
    doExtensiveProfiling = 1;
  }
  else if (2 < argc) goto LAB_001133d0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  EVar1 = test_internals();
  if (EVar1 == TA_TEST_PASS) {
    EVar1 = test_abstract();
    if (EVar1 == TA_TEST_PASS) {
      if (doExtensiveProfiling != 0) {
        return 0;
      }
      EVar1 = allocLib();
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      local_50.nbBars = 0xfc;
      local_50.open = TA_SREF_open_daily_ref_0_PRIV;
      local_50.high = TA_SREF_high_daily_ref_0_PRIV;
      local_50.low = TA_SREF_low_daily_ref_0_PRIV;
      local_50.close = TA_SREF_close_daily_ref_0_PRIV;
      local_50.volume = TA_SREF_volume_daily_ref_0_PRIV;
      puts("Testing the TA functions");
      initGlobalBuffer();
      printf("%50s: Testing....","MATH,VECTOR,DCPERIOD/PHASE,TRENDLINE/MODE");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_1in_1out(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","All Moving Averages");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_ma(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","AROON,CORREL,BETA");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_per_hl(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","CCI,WILLR,ULTOSC,NATR");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_per_hlc(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","BOP,AVGPRICE");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_per_ohlc(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","RSI,CMO");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_rsi(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","IMI");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_imi(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","MIN,MAX,MININDEX,MAXINDEX,MINMAX,MINMAXINDEX");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_minmax(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","PO,APO");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_po(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","ADX,ADXR,DI,DM,DX");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_adx(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","SAR,SAREXT");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_sar(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","STOCH,STOCHF,STOCHRSI");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_stoch(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","MFI,AD,ADOSC");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_per_hlcv(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","PHASOR,SINE");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_1in_2out(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","TRIX");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_per_ema(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","MACD,MACDFIX,MACDEXT");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_macd(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","MOM,ROC,ROCP,ROCR,ROCR100");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_mom_roc(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","TRANGE,ATR");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_trange(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","STDDEV,VAR");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_stddev(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","AVGDEV");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_avgdev(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","BBANDS");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_bbands(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","All Candlesticks");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_candlestick(&local_50);
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      EVar1 = freeLib();
      if (EVar1 != TA_TEST_PASS) {
        return EVar1;
      }
      if (insufficientClockPrecision == 0) {
        if (0 < nbProfiledCall) {
          printf("\nNumber profiled function call       = %d function calls");
          printf("\nTotal execution time                = %g milliseconds",
                 (timeInProfiledCall / 1000000.0) / 1000.0);
          printf("\nWorst single function call          = %g milliseconds",
                 (worstProfiledCall / 1000000.0) / 1000.0);
          printf("\nAverage execution time per function = %g microseconds\n",
                 ((timeInProfiledCall / 1000000.0) / 1000000.0) / (double)nbProfiledCall);
        }
      }
      else {
        puts("\nWarning: Code profiling not supported for this platform.");
      }
      puts("\n* All tests succeeded. Enjoy the library. *");
      return 0;
    }
    pcVar2 = "Failed: Abstract interface Tests (error number = %d)\n";
  }
  else {
    pcVar2 = "\nFailed an internal test with code=%d\n";
  }
  printf(pcVar2,(ulong)EVar1);
  return EVar1;
}

Assistant:

int main( int argc, char **argv )
{
#ifdef WIN32
	LARGE_INTEGER QPFrequency;
#endif
   double freq;

   ErrorNumber retValue;

   (void)argv;

   insufficientClockPrecision = 0;
   timeInProfiledCall = 0.0;
   worstProfiledCall = 0.0;
   nbProfiledCall = 0;
   doExtensiveProfiling = 0;

   printf( "\n" );
   printf( "ta_regtest V%s - Regression Tests of TA-Lib code\n", TA_GetVersionString() );
   printf( "\n" );

   if( argc == 2 )
   {
	   /* Detect option to perform extended profiling. */
	   if( (argv[1][0] == '-') && (argv[1][1] == 'p') && (argv[1][2] == '\0'))
	   {
		   doExtensiveProfiling = 1;
	   }
	   else
	   {
		   printUsage();
		   return TA_REGTEST_BAD_USER_PARAM;
	   }
   }

   if( argc > 2 )
   {
      printUsage();
      return TA_REGTEST_BAD_USER_PARAM;
   }

   /* Some tests are using randomness. */
   srand( (unsigned)time( NULL ) );

   /* Test utility like List/Stack/Dictionary/Memory Allocation etc... */
   retValue = test_internals();
   if( retValue != TA_TEST_PASS )
   {
      printf( "\nFailed an internal test with code=%d\n", retValue );
      return retValue;
   }

   /* Test abstract interface. */
   retValue = test_abstract();
   if( retValue != TA_TEST_PASS )
   {
      printf( "Failed: Abstract interface Tests (error number = %d)\n", retValue );
      return retValue;
   }

   /* Perform all regresstions tests (except when ta_regtest is executed for profiling only). */
   if( !doExtensiveProfiling )
   {
      retValue = test_with_simulator();
      if( retValue != TA_TEST_PASS )
         return retValue;

      if( insufficientClockPrecision != 0 )
      {
   	   printf( "\nWarning: Code profiling not supported for this platform.\n" );
      }
      else if( nbProfiledCall > 0 )
      {
         printf( "\nNumber profiled function call       = %d function calls", nbProfiledCall );

#ifdef WIN32
         QueryPerformanceFrequency(&QPFrequency);
         freq = (double)QPFrequency.QuadPart;
         printf( "\nTotal execution time                = %g milliseconds", (timeInProfiledCall/freq)*1000.0 );
         printf( "\nWorst single function call          = %g milliseconds", (worstProfiledCall/freq)*1000.0 );
         printf( "\nAverage execution time per function = %g microseconds\n", ((timeInProfiledCall/freq)*1000000.0)/((double)nbProfiledCall) );
#else
         freq = (double)CLOCKS_PER_SEC;
         printf( "\nTotal execution time                = %g milliseconds", timeInProfiledCall/freq/1000.0 );
         printf( "\nWorst single function call          = %g milliseconds", worstProfiledCall/freq/1000.0 );
         printf( "\nAverage execution time per function = %g microseconds\n", (timeInProfiledCall/freq/1000000.0)/((double)nbProfiledCall) );
#endif
      }
      printf( "\n* All tests succeeded. Enjoy the library. *\n" );
   }


   return TA_TEST_PASS; /* Everything succeed !!! */
}